

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

int __thiscall CVmRun::compute_diff(CVmRun *this,vm_val_t *val1,vm_val_t *val2)

{
  int iVar1;
  CVmObject *pCVar2;
  undefined8 in_RDX;
  int *in_RSI;
  char *in_stack_00000030;
  vm_val_t *in_stack_00000038;
  vm_val_t *in_stack_00000040;
  vm_val_t *in_stack_ffffffffffffffc8;
  vm_val_t *in_stack_ffffffffffffffd0;
  
  while( true ) {
    iVar1 = *in_RSI;
    if (iVar1 == 5) {
      pCVar2 = vm_objp(0);
      iVar1 = (*pCVar2->_vptr_CVmObject[0x23])(pCVar2,in_RSI,(ulong)(uint)in_RSI[2],in_RDX);
      return iVar1;
    }
    if (iVar1 != 7) break;
    iVar1 = vm_val_t::is_numeric(in_stack_ffffffffffffffd0);
    if (iVar1 == 0) {
      err_throw(0);
    }
    vm_val_t::promote_int(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  if (iVar1 == 10) {
    get_const_ptr(0);
    CVmObjList::sub_from_list
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,(vm_val_t *)this);
    return 1;
  }
  return 0;
}

Assistant:

int CVmRun::compute_diff(VMG_ vm_val_t *val1, vm_val_t *val2)
{
    /* the meaning of "subtract" depends on the type of the first operand */
check_type:
    switch(val1->typ)
    {
    case VM_LIST:
        /* 
         *   list constant - remove the second value from the list, using
         *   the static list subtraction method 
         */
        CVmObjList::sub_from_list(vmg_ val1, val1,
                                  get_const_ptr(vmg_ val1->val.ofs), val2);
        return TRUE;

    case VM_OBJ:
        /* object - use the object's virtual subtraction method */
        return vm_objp(vmg_ val1->val.obj)->sub_val(
            vmg_ val1, val1->val.obj, val2);

    case VM_INT:
        /* 
         *   callers handle the int-int case inline, so we can skip that;
         *   check for other numeric types 
         */
        if (val2->is_numeric(vmg0_))
        {
            /* 
             *   the other value is numeric but not an integer; promote the
             *   integer to the other type, then re-do the type check 
             */
            val2->promote_int(vmg_ val1);
            goto check_type;
        }
        else
        {
            /* other values can't be subtracted */
            err_throw(VMERR_NUM_VAL_REQD);
            AFTER_ERR_THROW(return FALSE;)
        }

    default:
        /* other types cannot be subtracted */
        return FALSE;
    }
}